

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O2

TestCaseGroup * vkt::texture::createFilteringAnisotropyTests(TestContext *testCtx)

{
  float fVar1;
  FilterMode FVar2;
  FilterMode FVar3;
  TestCaseGroup *pTVar4;
  FilteringAnisotropyTests *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  allocator<char> local_217;
  allocator<char> local_216;
  allocator<char> local_215;
  float local_214;
  TestContext *local_210;
  FilteringAnisotropyTests *local_208;
  undefined8 *local_200;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> levelAnisotropyGroups;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> mipmapTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicTests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> filteringAnisotropyTests;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  AnisotropyParams refParams;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  local_210 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,testCtx,"filtering_anisotropy","Filtering anisotropy tests");
  filteringAnisotropyTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,local_210,"basic","Filtering anisotropy tests");
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,local_210,"mipmap","Filtering anisotropy tests");
  mipmapTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar4;
  for (lVar7 = 0;
      pTVar4 = basicTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 4; lVar7 = lVar7 + 1) {
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar4,local_210,(&PTR_anon_var_dwarf_1344098_00c0c8d0)[lVar7],
               "Filtering anisotropy tests");
    local_214 = (float)(&DAT_009f2150)[lVar7];
    pFVar5 = (FilteringAnisotropyTests *)0x0;
    levelAnisotropyGroups.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar4;
    while (pTVar4 = levelAnisotropyGroups.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr, pFVar5 != (FilteringAnisotropyTests *)0x2) {
      FVar2 = tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[(long)pFVar5];
      local_200 = &DAT_00c0c8f0;
      local_208 = pFVar5;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 4) {
        FVar3 = *(FilterMode *)
                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes +
                 lVar8);
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&refParams.super_ReferenceParams,TEXTURETYPE_2D);
        pTVar4 = levelAnisotropyGroups.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        refParams.maxAnisotropy = local_214;
        refParams.mipMap = false;
        refParams.minFilter = FVar2;
        refParams.magFilter = FVar3;
        pFVar5 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)*local_200,&local_215);
        std::operator+(&local_f8,"mag_",&local_118);
        std::operator+(&local_178,&local_f8,"_min_");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,(char *)(&DAT_00c0c8f0)[(long)local_208],&local_216);
        std::operator+(&local_198,&local_178,&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"Texture filtering anisotropy basic tests",&local_217);
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (pFVar5,local_210,&local_198,&local_158,&refParams);
        tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pFVar5);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        local_200 = local_200 + 1;
      }
      pFVar5 = (FilteringAnisotropyTests *)
               ((long)&(local_208->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 1)
      ;
    }
    levelAnisotropyGroups.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(basicTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&levelAnisotropyGroups.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(filteringAnisotropyTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  for (lVar7 = 0;
      pTVar4 = mipmapTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 4; lVar7 = lVar7 + 1) {
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar4,local_210,(&PTR_anon_var_dwarf_1344098_00c0c8d0)[lVar7],
               "Filtering anisotropy tests");
    fVar1 = (float)(&DAT_009f2150)[lVar7];
    levelAnisotropyGroups.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         pTVar4;
    for (lVar8 = 0;
        pTVar4 = levelAnisotropyGroups.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar8 != 4; lVar8 = lVar8 + 1) {
      local_214 = (float)(&DAT_009f2160)[lVar8];
      local_200 = &DAT_00c0c8f0;
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
        FVar2 = *(FilterMode *)
                 ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes +
                 lVar6);
        glu::TextureTestUtil::ReferenceParams::ReferenceParams
                  (&refParams.super_ReferenceParams,TEXTURETYPE_2D);
        pTVar4 = levelAnisotropyGroups.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        refParams.minFilter = (FilterMode)local_214;
        refParams.mipMap = true;
        refParams.maxAnisotropy = fVar1;
        refParams.magFilter = FVar2;
        local_208 = (FilteringAnisotropyTests *)operator_new(0x118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,(char *)*local_200,&local_215);
        std::operator+(&local_f8,"mag_",&local_118);
        std::operator+(&local_178,&local_f8,"_min_");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,&DAT_009f2340 + *(int *)(&DAT_009f2340 + lVar8 * 4),
                   &local_216);
        std::operator+(&local_198,&local_178,&local_138);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"Texture filtering anisotropy basic tests",&local_217);
        pFVar5 = local_208;
        anon_unknown_0::FilteringAnisotropyTests::FilteringAnisotropyTests
                  (local_208,local_210,&local_198,&local_158,&refParams);
        tcu::TestNode::addChild(&pTVar4->super_TestNode,(TestNode *)pFVar5);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        local_200 = local_200 + 1;
      }
    }
    levelAnisotropyGroups.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
         (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(mipmapTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar4->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&levelAnisotropyGroups.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  mipmapTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(filteringAnisotropyTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar4->super_TestNode);
  pTVar4 = filteringAnisotropyTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  filteringAnisotropyTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&mipmapTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&basicTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&filteringAnisotropyTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createFilteringAnisotropyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	filteringAnisotropyTests	(new tcu::TestCaseGroup(testCtx,	"filtering_anisotropy",	"Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	basicTests					(new tcu::TestCaseGroup(testCtx, "basic", "Filtering anisotropy tests"));
	de::MovePtr<tcu::TestCaseGroup>	mipmapTests					(new tcu::TestCaseGroup(testCtx, "mipmap", "Filtering anisotropy tests"));
	const char*						valueName[]					=
	{
		"anisotropy_2",
		"anisotropy_4",
		"anisotropy_8",
		"anisotropy_max"
	};
	const float						maxAnisotropy[]				=
	{
		2.0f,
		4.0f,
		8.0f,
		10000.0f	//too huge will be flated to max value
	};
	const char*						magFilterName[]				=
	{
		"nearest",
		"linear"
	};
	const tcu::Sampler::FilterMode	magFilters[]				=
	{
		Sampler::NEAREST,
		Sampler::LINEAR
	};

	{
		const tcu::Sampler::FilterMode*	minFilters		= magFilters;
		const char**					minFilterName	= magFilterName;

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx]);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			basicTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(basicTests.release());
	}

	{
		const tcu::Sampler::FilterMode		minFilters[]	=
		{
			Sampler::NEAREST_MIPMAP_NEAREST,
			Sampler::NEAREST_MIPMAP_LINEAR,
			Sampler::LINEAR_MIPMAP_NEAREST,
			Sampler::LINEAR_MIPMAP_LINEAR
		};
		const char*							minFilterName[]	=
		{
			"nearest_mipmap_nearest",
			"nearest_mipmap_linear",
			"linear_mipmap_nearest",
			"linear_mipmap_linear"
		};

		for (int anisotropyNdx = 0; anisotropyNdx < DE_LENGTH_OF_ARRAY(maxAnisotropy); anisotropyNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup> levelAnisotropyGroups (new tcu::TestCaseGroup(testCtx, valueName[anisotropyNdx], "Filtering anisotropy tests"));

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
			for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
			{
				AnisotropyParams	refParams	(TEXTURETYPE_2D, maxAnisotropy[anisotropyNdx] ,minFilters[minFilterNdx], magFilters[magFilterNdx], true);
				levelAnisotropyGroups->addChild(new FilteringAnisotropyTests(testCtx,
														"mag_" + string(magFilterName[magFilterNdx]) + "_min_" + string(minFilterName[minFilterNdx]),
														"Texture filtering anisotropy basic tests", refParams));
			}
			mipmapTests->addChild(levelAnisotropyGroups.release());
		}
		filteringAnisotropyTests->addChild(mipmapTests.release());
	}

	return filteringAnisotropyTests.release();
}